

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<capnp::compiler::Compiler::CompiledModule>::disposeImpl
          (HeapDisposer<capnp::compiler::Compiler::CompiledModule> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    capnp::compiler::Compiler::Node::Content::~Content((Content *)((long)pointer + 0x198));
    if (*(long *)((long)pointer + 0x108) != 0) {
      capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)((long)pointer + 0x100));
    }
    capnp::MallocMessageBuilder::~MallocMessageBuilder
              ((MallocMessageBuilder *)((long)pointer + 0x10));
  }
  operator_delete(pointer,0x2e0);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }